

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_wrong_opcode_in_fragment(void)

{
  _Bool _Var1;
  cio_error cVar2;
  undefined1 local_b8 [4];
  cio_error err;
  ws_frame frames [5];
  char data [12];
  
  memset(&frames[4].field_0x1c,0x61,0xc);
  local_b8 = (undefined1  [4])0x1;
  err = CIO_SUCCESS;
  frames[0]._0_8_ = &frames[4].field_0x1c;
  frames[0].data = (void *)0xc;
  frames[0].data_length._0_1_ = 0;
  frames[0].data_length._1_1_ = 0;
  frames[0].last_frame = false;
  frames[0].rsv = false;
  frames[0]._26_2_ = 0;
  frames[0]._28_4_ = 0;
  frames[1]._0_8_ = &frames[4].field_0x1c;
  frames[1].data = (void *)0xc;
  frames[1].data_length._0_1_ = 1;
  frames[1].data_length._1_1_ = 0;
  frames[1].last_frame = false;
  frames[1].rsv = false;
  frames[1]._26_2_ = 0;
  frames[1]._28_4_ = 0;
  frames[2]._0_8_ = &frames[4].field_0x1c;
  frames[2].data = (void *)0xc;
  frames[2].data_length._0_1_ = 0;
  frames[2].data_length._1_1_ = 0;
  frames[2].last_frame = true;
  frames[2].rsv = false;
  frames[2]._26_2_ = 0;
  frames[2]._28_4_ = 0;
  frames[3]._0_8_ = &frames[4].field_0x1c;
  frames[3].data = (void *)0xc;
  frames[3].data_length._0_1_ = 1;
  frames[3].data_length._1_1_ = 0;
  frames[3].last_frame = true;
  frames[3].rsv = false;
  frames[3]._26_2_ = 0;
  frames[3]._28_4_ = 0;
  frames[4].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
  frames[4].direction = FROM_CLIENT;
  frames[4].data = (void *)0x0;
  frames[4].data_length._0_1_ = 1;
  frames[4].data_length._1_1_ = 0;
  serialize_frames((ws_frame *)local_b8,5);
  *(ushort *)&(ws->ws_private).ws_flags =
       *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(err == CIO_SUCCESS) << 10;
  cVar2 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Could not start reading a message!",0x676,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (3,(ulong)read_handler_fake.call_count,"read_handler was not called",0x678,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[2],
             "websocket parameter of read_handler not correct",0x67a,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of read_handler not correct",0x67b);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_history[2],"err parameter of read_handler not correct",
             0x67c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_error_fake.call_count,"error callback was called",0x67e,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
             "ws parameter in first fragment of error callback not correct",0x67f,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (-0x5d,(long)on_error_fake.arg1_val,"status parameter in error callback not correct",
             0x680,UNITY_DISPLAY_STYLE_INT);
  _Var1 = is_close_frame(0x3ea,true);
  if (!_Var1) {
    UnityFail("written frame is not a close frame!",0x681);
  }
  return;
}

Assistant:

static void test_wrong_opcode_in_fragment(void)
{
	char data[12];
	memset(data, 'a', sizeof(data));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(3, read_handler_fake.call_count, "read_handler was not called");

	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[2], "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[2], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[2], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in first fragment of error callback not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_PROTOCOL_NOT_SUPPORTED, on_error_fake.arg1_val, "status parameter in error callback not correct");
	TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, true), "written frame is not a close frame!");
}